

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O2

void __thiscall QFileDialogPrivate::pathChanged(QFileDialogPrivate *this,QString *newPath)

{
  QFileDialog *this_00;
  QWidget *this_01;
  QSidebar *this_02;
  QFileDialogComboBox *pQVar1;
  bool bVar2;
  int iVar3;
  long in_FS_OFFSET;
  HistoryItem local_88;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QFileDialog **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  this_01 = (QWidget *)((this->qFileDialogUi).d)->toParentButton;
  QFileSystemModel::rootPath();
  bVar2 = (bool)QFileInfo::exists((QString *)&local_88);
  QWidget::setEnabled(this_01,bVar2);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
  this_02 = ((this->qFileDialogUi).d)->sidebar;
  QUrl::fromLocalFile((QString *)&local_88);
  QSidebar::selectUrl(this_02,(QUrl *)&local_88);
  QUrl::~QUrl((QUrl *)&local_88);
  pQVar1 = ((this->qFileDialogUi).d)->lookInCombo;
  local_88.path.d.d = (Data *)(pQVar1->m_history).d.d;
  local_88.path.d.ptr = (char16_t *)(pQVar1->m_history).d.ptr;
  local_88.path.d.size = (pQVar1->m_history).d.size;
  if (local_88.path.d.d != (Data *)0x0) {
    LOCK();
    (((Data *)local_88.path.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_88.path.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
         + 1;
    UNLOCK();
  }
  QFileDialog::setHistory(this_00,(QStringList *)&local_88);
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_88);
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QDir::toNativeSeparators((QString *)&local_58);
  if (-1 < (long)this->currentHistoryLocation) {
    QList<QFileDialogPrivate::HistoryItem>::value
              (&local_88,&this->currentHistory,(long)this->currentHistoryLocation);
    bVar2 = ::operator!=(&local_88.path,(QString *)&local_58);
    HistoryItem::~HistoryItem(&local_88);
    iVar3 = this->currentHistoryLocation;
    if (!bVar2) goto LAB_0049f965;
    if (-1 < iVar3) {
      saveHistorySelection(this);
    }
  }
  while ((-1 < this->currentHistoryLocation &&
         ((ulong)(uint)this->currentHistoryLocation + 1 < (ulong)(this->currentHistory).d.size))) {
    QList<QFileDialogPrivate::HistoryItem>::removeLast(&this->currentHistory);
  }
  local_88.path.d.d = local_58.d;
  local_88.path.d.ptr = local_58.ptr;
  local_88.path.d.size = local_58.size;
  if (local_58.d != (Data *)0x0) {
    LOCK();
    ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_88.selection.d.d = (Data *)0x0;
  local_88.selection.d.ptr = (QPersistentModelIndex *)0x0;
  local_88.selection.d.size = 0;
  QList<QFileDialogPrivate::HistoryItem>::emplaceBack<QFileDialogPrivate::HistoryItem>
            (&this->currentHistory,&local_88);
  HistoryItem::~HistoryItem(&local_88);
  iVar3 = this->currentHistoryLocation + 1;
  this->currentHistoryLocation = iVar3;
LAB_0049f965:
  QWidget::setEnabled((QWidget *)((this->qFileDialogUi).d)->forwardButton,
                      1 < (this->currentHistory).d.size - (long)iVar3);
  QWidget::setEnabled((QWidget *)((this->qFileDialogUi).d)->backButton,
                      0 < this->currentHistoryLocation);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialogPrivate::pathChanged(const QString &newPath)
{
    Q_Q(QFileDialog);
    qFileDialogUi->toParentButton->setEnabled(QFileInfo::exists(model->rootPath()));
    qFileDialogUi->sidebar->selectUrl(QUrl::fromLocalFile(newPath));
    q->setHistory(qFileDialogUi->lookInCombo->history());

    const QString newNativePath = QDir::toNativeSeparators(newPath);

    // equal paths indicate this was invoked by _q_navigateBack/Forward()
    if (currentHistoryLocation < 0 || currentHistory.value(currentHistoryLocation).path != newNativePath) {
        if (currentHistoryLocation >= 0)
            saveHistorySelection();
        while (currentHistoryLocation >= 0 && currentHistoryLocation + 1 < currentHistory.size()) {
            currentHistory.removeLast();
        }
        currentHistory.append({newNativePath, PersistentModelIndexList()});
        ++currentHistoryLocation;
    }
    qFileDialogUi->forwardButton->setEnabled(currentHistory.size() - currentHistoryLocation > 1);
    qFileDialogUi->backButton->setEnabled(currentHistoryLocation > 0);
}